

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_dictionary.hpp
# Opt level: O0

void __thiscall
duckdb::PrimitiveDictionary<long,_long,_duckdb::ParquetCastOperator>::PrimitiveDictionary
          (PrimitiveDictionary<long,_long,_duckdb::ParquetCastOperator> *this,Allocator *allocator_p
          ,idx_t maximum_size_p,idx_t maximum_target_capacity_p)

{
  undefined8 uVar1;
  MemoryStream *this_00;
  data_ptr_t pdVar2;
  idx_t iVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  Allocator *in_RDI;
  Allocator *size;
  AllocatedData *this_01;
  idx_t i;
  ulong local_38;
  
  *(undefined8 *)in_RDI = in_RSI;
  *(undefined8 *)(in_RDI + 8) = in_RDX;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  uVar1 = duckdb::NextPowerOfTwo(*(long *)(in_RDI + 8) * 2);
  *(undefined8 *)(in_RDI + 0x18) = uVar1;
  *(long *)(in_RDI + 0x20) = *(long *)(in_RDI + 0x18) + -1;
  *(undefined8 *)(in_RDI + 0x28) = in_RCX;
  size = in_RDI + 0x30;
  Allocator::Allocate(in_RDI,(idx_t)size);
  Allocator::Allocate(in_RDI,(idx_t)size);
  this_00 = (MemoryStream *)(in_RDI + 0x60);
  this_01 = (AllocatedData *)(in_RDI + 0x48);
  pdVar2 = AllocatedData::get(this_01);
  iVar3 = AllocatedData::GetSize(this_01);
  duckdb::MemoryStream::MemoryStream(this_00,pdVar2,iVar3);
  pdVar2 = AllocatedData::get((AllocatedData *)(in_RDI + 0x30));
  *(data_ptr_t *)(in_RDI + 0x90) = pdVar2;
  in_RDI[0x98] = (Allocator)0x0;
  for (local_38 = 0; local_38 < *(ulong *)(in_RDI + 0x18); local_38 = local_38 + 1) {
    *(undefined4 *)(*(long *)(in_RDI + 0x90) + local_38 * 0x10 + 8) = 0xffffffff;
  }
  return;
}

Assistant:

PrimitiveDictionary(Allocator &allocator_p, idx_t maximum_size_p, idx_t maximum_target_capacity_p)
	    : allocator(allocator_p), maximum_size(maximum_size_p), size(0),
	      capacity(NextPowerOfTwo(maximum_size * LOAD_FACTOR)), capacity_mask(capacity - 1),
	      maximum_target_capacity(maximum_target_capacity_p),
	      allocated_dictionary(allocator.Allocate(capacity * sizeof(primitive_dictionary_entry_t))),
	      allocated_target(allocator.Allocate(std::is_same<TGT, string_t>::value
	                                              ? MinValue(INITIAL_TARGET_CAPACITY, maximum_target_capacity)
	                                              : capacity * sizeof(TGT))),
	      target_stream(allocated_target.get(), allocated_target.GetSize()),
	      dictionary(reinterpret_cast<primitive_dictionary_entry_t *>(allocated_dictionary.get())), full(false) {
		// Initialize empty
		for (idx_t i = 0; i < capacity; i++) {
			dictionary[i].index = INVALID_INDEX;
		}
	}